

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathNodeSetClearFromPos(xmlNodeSetPtr set,int pos,int hasNsNodes)

{
  xmlNodePtr ns;
  xmlNodePtr node;
  int i;
  int hasNsNodes_local;
  int pos_local;
  xmlNodeSetPtr set_local;
  
  if ((set != (xmlNodeSetPtr)0x0) && (pos < set->nodeNr)) {
    node._4_4_ = pos;
    if (hasNsNodes != 0) {
      for (; node._4_4_ < set->nodeNr; node._4_4_ = node._4_4_ + 1) {
        ns = set->nodeTab[node._4_4_];
        if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
          xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
        }
      }
    }
    set->nodeNr = pos;
  }
  return;
}

Assistant:

static void
xmlXPathNodeSetClearFromPos(xmlNodeSetPtr set, int pos, int hasNsNodes)
{
    if ((set == NULL) || (pos >= set->nodeNr))
	return;
    else if ((hasNsNodes)) {
	int i;
	xmlNodePtr node;

	for (i = pos; i < set->nodeNr; i++) {
	    node = set->nodeTab[i];
	    if ((node != NULL) &&
		(node->type == XML_NAMESPACE_DECL))
		xmlXPathNodeSetFreeNs((xmlNsPtr) node);
	}
    }
    set->nodeNr = pos;
}